

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar5;
  Fad<double> *pFVar6;
  double *pdVar7;
  double *pdVar8;
  ulong uVar9;
  double dVar10;
  
  uVar1 = (((((fadexpr->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  uVar2 = (this->dx_).num_elts;
  if (uVar1 != uVar2) {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar8 = (this->dx_).ptr_to_data;
        if (pdVar8 != (double *)0x0) {
          operator_delete__(pdVar8);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar2 != 0) {
        pdVar8 = (this->dx_).ptr_to_data;
        if (pdVar8 != (double *)0x0) {
          operator_delete__(pdVar8);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar1;
      uVar9 = 0xffffffffffffffff;
      if (-1 < (int)uVar1) {
        uVar9 = (long)(int)uVar1 << 3;
      }
      pdVar8 = (double *)operator_new__(uVar9);
      (this->dx_).ptr_to_data = pdVar8;
    }
  }
  if (uVar1 != 0) {
    pdVar8 = (this->dx_).ptr_to_data;
    pFVar5 = (fadexpr->fadexpr_).right_;
    pFVar6 = (pFVar5->fadexpr_).right_;
    if ((pFVar6->dx_).num_elts == 0) {
      if (0 < (int)uVar1) {
        iVar3 = (fadexpr->fadexpr_).left_.constant_;
        iVar4 = (pFVar5->fadexpr_).left_.constant_;
        uVar9 = 0;
        do {
          dVar10 = pFVar6->val_ + (double)iVar4;
          pdVar8[uVar9] = (-pFVar6->defaultVal * (double)iVar3) / (dVar10 * dVar10);
          uVar9 = uVar9 + 1;
        } while (uVar1 != uVar9);
      }
    }
    else if (0 < (int)uVar1) {
      pdVar7 = (pFVar6->dx_).ptr_to_data;
      iVar3 = (fadexpr->fadexpr_).left_.constant_;
      iVar4 = (pFVar5->fadexpr_).left_.constant_;
      uVar9 = 0;
      do {
        dVar10 = pFVar6->val_ + (double)iVar4;
        pdVar8[uVar9] = (-pdVar7[uVar9] * (double)iVar3) / (dVar10 * dVar10);
        uVar9 = uVar9 + 1;
      } while (uVar1 != uVar9);
    }
  }
  pFVar5 = (fadexpr->fadexpr_).right_;
  this->val_ = (double)(fadexpr->fadexpr_).left_.constant_ /
               ((double)(pFVar5->fadexpr_).left_.constant_ + ((pFVar5->fadexpr_).right_)->val_);
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}